

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result wabt::WastParser::ResolveRefTypes
                 (Module *module,TypeVector *types,ReferenceVars *ref_vars,Errors *errors)

{
  Var *this;
  pointer pRVar1;
  pointer pTVar2;
  Index IVar3;
  string *psVar4;
  pointer pRVar5;
  ulong uVar6;
  Type type;
  ErrorLevel local_6c;
  Type local_68;
  vector<wabt::Error,std::allocator<wabt::Error>> *local_60;
  BindingHash *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pRVar5 = (ref_vars->
           super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (ref_vars->
           super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = &module->type_bindings;
  local_60 = (vector<wabt::Error,std::allocator<wabt::Error>> *)errors;
  do {
    if (pRVar5 == pRVar1) {
      return (Result)Ok;
    }
    uVar6 = (ulong)pRVar5->index;
    if (uVar6 != 0xffffffff) {
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl
                        .super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) <= uVar6) {
        __assert_fail("index < types->size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x51e,
                      "static Result wabt::WastParser::ResolveRefTypes(const Module &, TypeVector *, ReferenceVars *, Errors *)"
                     );
      }
      local_68 = pTVar2[uVar6];
      pRVar5->index = 0xffffffff;
      if (local_68.enum_ != Reference) {
        __assert_fail("type.IsReferenceWithIndex()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x522,
                      "static Result wabt::WastParser::ResolveRefTypes(const Module &, TypeVector *, ReferenceVars *, Errors *)"
                     );
      }
      IVar3 = Type::GetReferenceIndex(&local_68);
      if (IVar3 == 0xffffffff) {
        this = &pRVar5->var;
        psVar4 = Var::name_abi_cxx11_(this);
        IVar3 = BindingHash::FindIndex(local_58,psVar4);
        if (IVar3 == 0xffffffff) {
          local_6c = Error;
          psVar4 = Var::name_abi_cxx11_(this);
          StringPrintf_abi_cxx11_
                    (&local_50,"undefined reference type name %s",(psVar4->_M_dataplus)._M_p);
          std::vector<wabt::Error,std::allocator<wabt::Error>>::
          emplace_back<wabt::ErrorLevel,wabt::Location&,std::__cxx11::string>
                    (local_60,&local_6c,&this->loc,&local_50);
          std::__cxx11::string::_M_dispose();
        }
        else {
          Type::Type((Type *)&local_50,local_68.enum_,IVar3);
          (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (Type)local_50._M_dataplus._M_p;
        }
      }
    }
    pRVar5 = pRVar5 + 1;
  } while( true );
}

Assistant:

Result WastParser::ResolveRefTypes(const Module& module,
                                   TypeVector* types,
                                   ReferenceVars* ref_vars,
                                   Errors* errors) {
  Result result = Result::Ok;

  for (auto& ref_var : *ref_vars) {
    uint32_t index = ref_var.index;

    // The index of resolved variables is converted to kInvalidIndex.
    if (index == kInvalidIndex) {
      continue;
    }

    assert(index < types->size());
    Type type = (*types)[index];
    ref_var.index = kInvalidIndex;

    assert(type.IsReferenceWithIndex());

    if (type.GetReferenceIndex() != kInvalidIndex) {
      continue;
    }

    const auto type_index = module.type_bindings.FindIndex(ref_var.var.name());

    if (type_index == kInvalidIndex) {
      errors->emplace_back(ErrorLevel::Error, ref_var.var.loc,
                           StringPrintf("undefined reference type name %s",
                                        ref_var.var.name().c_str()));
      result = Result::Error;
      continue;
    }

    (*types)[index] = Type(static_cast<Type::Enum>(type), type_index);
  }

  return Result::Ok;
}